

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFormat::emulate_mthd(MthdEmuEmuD3D0TexFormat *this)

{
  uint uVar1;
  uint uVar2;
  int local_24;
  int i;
  int min_l;
  int max_l;
  int sfmt;
  int fmt;
  MthdEmuEmuD3D0TexFormat *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x3c);
  if (uVar1 == 0) {
    max_l = 2;
  }
  else if (uVar1 == 1) {
    max_l = 3;
  }
  else if (uVar1 == 2) {
    max_l = 4;
  }
  else {
    max_l = 5;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val >> 0x1c;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffdfffff |
       0x200000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffff7fff |
       0x8000;
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xfffffffd;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xfffffffb;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xffffffbf;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xfffff07f | max_l << 7;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xffff0fff |
           ((uVar2 - (uint)(((ulong)uVar1 << 0x24) >> 0x3c)) + 1 & 0xf) << 0xc;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xfff0ffff | uVar2 << 0x10;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_24] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_24] & 0xff0fffff | uVar2 << 0x14;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                          local_24 + 4,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_format[local_24],false);
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] =
         (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2e) >> 0x3e) |
         0x4003ffc0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
         (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2e) >> 0x3e) | 0x3ffc0;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,6,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_control_a[0],false);
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,7,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_control_a[1],true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		int fmt = 5;
		int sfmt = extr(val, 20, 4);
		if (sfmt == 0)
			fmt = 2;
		else if (sfmt == 1)
			fmt = 3;
		else if (sfmt == 2)
			fmt = 4;
		else if (sfmt == 3)
			fmt = 5;
		int max_l = extr(val, 28, 4);
		int min_l = extr(val, 24, 4);
		insrt(exp.valid[1], 21, 1, 1);
		insrt(exp.valid[1], 15, 1, 1);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_format[i], 1, 1, 0);
				insrt(exp.bundle_tex_format[i], 2, 1, 0);
				insrt(exp.bundle_tex_format[i], 6, 1, 0);
				insrt(exp.bundle_tex_format[i], 7, 5, fmt);
				insrt(exp.bundle_tex_format[i], 12, 4, max_l - min_l + 1);
				insrt(exp.bundle_tex_format[i], 16, 4, max_l);
				insrt(exp.bundle_tex_format[i], 20, 4, max_l);
				pgraph_celsius_icmd(&exp, 4 + i, exp.bundle_tex_format[i], false);
			}
			exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 16, 2);
			exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 16, 2);
			pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
			pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
		}
	}